

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::Replace
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,size_t pos,size_t posNew)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  iterator iVar4;
  _List_node_base *p_Var5;
  ulong uVar6;
  const_iterator __position;
  
  if (pos == posNew) {
    return;
  }
  uVar6 = 1L << ((byte)pos & 0x3f);
  p_Var5 = (_List_node_base *)this;
  while (p_Var5 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var5->_M_next)->
                  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var5 != (_List_node_base *)this) {
    uVar2 = *(ulong *)((long)(p_Var5 + 1) + (pos >> 6) * 8);
    if ((uVar2 & uVar6) != 0) {
      *(ulong *)((long)(p_Var5 + 1) + (pos >> 6) * 8) = uVar2 ^ uVar6;
      puVar1 = (ulong *)((long)(p_Var5 + 1) + (posNew >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)posNew & 0x3f);
    }
  }
  std::__cxx11::list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>>::sort<GF2::MOGrevlex<136ul>>();
  iVar4._M_node =
       (this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
       super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while ((__position._M_node = iVar4._M_node, __position._M_node != (_List_node_base *)this &&
         (iVar4._M_node = (__position._M_node)->_M_next, iVar4._M_node != (_List_node_base *)this)))
  {
    bVar3 = WW<136ul>::operator==
                      ((WW<136ul> *)(__position._M_node + 1),(WW<136UL> *)(iVar4._M_node + 1));
    if (bVar3) {
      iVar4 = std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::erase
                        (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>,
                         __position);
      iVar4 = std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::erase
                        (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>,
                         iVar4._M_node);
    }
  }
  return;
}

Assistant:

void Replace(size_t pos, size_t posNew)
	{	
		if (pos == posNew)
			return;
		for (iterator iter = begin(); iter != end(); ++iter)
			// переменная pos входит в моном *iter?
			if (iter->Test(pos))
				iter->Flip(pos), iter->Set(posNew, 1);
		Normalize();
	}